

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

basic_appender<char>
fmt::v11::detail::write_significand<fmt::v11::basic_appender<char>,char>
          (basic_appender<char> out,char *significand,int significand_size,int integral_size,
          char decimal_point)

{
  char in_R8B;
  undefined7 in_stack_ffffffffffffffa8;
  char in_stack_ffffffffffffffaf;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  basic_appender<char> in_stack_ffffffffffffffb8;
  basic_appender<char> local_40 [2];
  buffer<char> *local_30;
  char local_21;
  basic_appender<char> local_10;
  buffer<char> *local_8;
  
  local_21 = in_R8B;
  local_30 = (buffer<char> *)
             copy_noinline<char,char_const*,fmt::v11::basic_appender<char>>
                       ((char *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                        (char *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8),
                        in_stack_ffffffffffffffb8);
  local_8 = local_30;
  if (local_21 != '\0') {
    local_10 = (basic_appender<char>)local_30;
    local_40[0] = basic_appender<char>::operator++(&local_10,0);
    basic_appender<char>::operator*(local_40);
    basic_appender<char>::operator=
              ((basic_appender<char> *)CONCAT17(local_21,in_stack_ffffffffffffffb0),
               in_stack_ffffffffffffffaf);
    local_8 = (buffer<char> *)
              copy_noinline<char,char_const*,fmt::v11::basic_appender<char>>
                        ((char *)CONCAT17(local_21,in_stack_ffffffffffffffb0),
                         (char *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8),
                         local_10);
  }
  return (basic_appender<char>)local_8;
}

Assistant:

FMT_CONSTEXPR auto write_significand(OutputIt out, const char* significand,
                                     int significand_size, int integral_size,
                                     Char decimal_point) -> OutputIt {
  out = detail::copy_noinline<Char>(significand, significand + integral_size,
                                    out);
  if (!decimal_point) return out;
  *out++ = decimal_point;
  return detail::copy_noinline<Char>(significand + integral_size,
                                     significand + significand_size, out);
}